

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImDrawList * __thiscall ImDrawList::CloneOutput(ImDrawList *this)

{
  ImVector<ImDrawCmd> *this_00;
  ImDrawList *pIVar1;
  long in_RDI;
  ImDrawListSharedData *in_stack_00000008;
  ImDrawList *in_stack_00000010;
  ImDrawList *dst;
  ImVector<ImDrawCmd> *src;
  size_t in_stack_ffffffffffffffc0;
  
  src = (ImVector<ImDrawCmd> *)0xa8;
  this_00 = (ImVector<ImDrawCmd> *)ImGui::MemAlloc(in_stack_ffffffffffffffc0);
  pIVar1 = (ImDrawList *)operator_new(src);
  ImDrawList(in_stack_00000010,in_stack_00000008);
  ImVector<ImDrawCmd>::operator=(this_00,src);
  ImVector<unsigned_int>::operator=((ImVector<unsigned_int> *)this_00,(ImVector<unsigned_int> *)src)
  ;
  ImVector<ImDrawVert>::operator=((ImVector<ImDrawVert> *)this_00,(ImVector<ImDrawVert> *)src);
  pIVar1->Flags = *(ImDrawListFlags *)(in_RDI + 0x30);
  return pIVar1;
}

Assistant:

ImDrawList* ImDrawList::CloneOutput() const
{
    ImDrawList* dst = IM_NEW(ImDrawList(_Data));
    dst->CmdBuffer = CmdBuffer;
    dst->IdxBuffer = IdxBuffer;
    dst->VtxBuffer = VtxBuffer;
    dst->Flags = Flags;
    return dst;
}